

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackGenerator::RunPreinstallTarget
          (cmCPackGenerator *this,string *installProjectName,string *installDirectory,
          cmGlobalGenerator *globalGenerator,string *buildConfig)

{
  cmCPackLog *pcVar1;
  long *msg;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  ostream *poVar7;
  string *psVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string output;
  int retVal;
  string buildCommand;
  string tmpFile;
  ostringstream cmCPackLog_msg_2;
  ostringstream cmCPackLog_msg;
  string local_498;
  int local_474;
  string local_470;
  string local_450;
  long *local_430;
  long local_420 [2];
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  undefined1 local_288 [96];
  ios_base local_228 [504];
  char *pcVar5;
  
  iVar4 = (*globalGenerator->_vptr_cmGlobalGenerator[0x1d])(globalGenerator);
  pcVar5 = (char *)CONCAT44(extraout_var,iVar4);
  if (pcVar5 != (char *)0x0) {
    local_298._0_8_ = local_288;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,pcVar5,pcVar5 + sVar6);
    pcVar5 = local_410 + 0x10;
    local_410._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"");
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&local_470,globalGenerator,(string *)local_298,buildConfig,(string *)local_410,
               &local_498,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,
                      CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                               local_498.field_2._M_local_buf[0]) + 1);
    }
    if ((char *)local_410._0_8_ != pcVar5) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"- Install command: ",0x13);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,local_470._M_dataplus._M_p,local_470._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar2 = local_410._0_8_;
    sVar6 = strlen((char *)local_410._0_8_);
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2b2,(char *)uVar2,sVar6);
    if ((char *)local_410._0_8_ != pcVar5) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base(local_228);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"- Run preinstall target for: ",0x1d);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_298,(installProjectName->_M_dataplus)._M_p,
                        installProjectName->_M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar2 = local_410._0_8_;
    sVar6 = strlen((char *)local_410._0_8_);
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2b5,(char *)uVar2,sVar6);
    if ((char *)local_410._0_8_ != pcVar5) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base(local_228);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    local_498._M_string_length = 0;
    local_498.field_2._M_local_buf[0] = '\0';
    local_474 = 1;
    bVar3 = cmSystemTools::RunSingleCommand
                      (&local_470,&local_498,&local_498,&local_474,
                       (installDirectory->_M_dataplus)._M_p,this->GeneratorVerbose,(cmDuration)0x0);
    if (!bVar3 || local_474 != 0) {
      local_410._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_410,"CPACK_TOPLEVEL_DIRECTORY","");
      psVar8 = (string *)GetOption(this,(string *)local_410);
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      local_298._8_8_ = (psVar8->_M_dataplus)._M_p;
      local_298._0_8_ = psVar8->_M_string_length;
      local_288._0_8_ = 0x15;
      local_288._8_8_ = "/PreinstallOutput.log";
      views._M_len = 2;
      views._M_array = (iterator)local_298;
      cmCatViews_abi_cxx11_(&local_450,views);
      if ((char *)local_410._0_8_ != pcVar5) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_298,&local_450,false,None);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"# Run command: ",0xf)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,local_470._M_dataplus._M_p,local_470._M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"# Directory: ",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(installDirectory->_M_dataplus)._M_p,
                          installDirectory->_M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"# Output:",9);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_498._M_dataplus._M_p,local_498._M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"Problem running install command: ",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_410,local_470._M_dataplus._M_p,local_470._M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Please check ",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_450._M_dataplus._M_p,local_450._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," for errors",0xb);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      msg = local_430;
      sVar6 = strlen((char *)local_430);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x2c7,(char *)msg,sVar6);
      if (local_430 != local_420) {
        operator_delete(local_430,local_420[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,
                        CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                 local_498.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      return 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,
                      CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                               local_498.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::RunPreinstallTarget(
  const std::string& installProjectName, const std::string& installDirectory,
  cmGlobalGenerator* globalGenerator, const std::string& buildConfig)
{
  // Does this generator require pre-install?
  if (const char* preinstall = globalGenerator->GetPreinstallTargetName()) {
    std::string buildCommand = globalGenerator->GenerateCMakeBuildCommand(
      preinstall, buildConfig, "", "", false);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Install command: " << buildCommand << std::endl);
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Run preinstall target for: " << installProjectName
                                                  << std::endl);
    std::string output;
    int retVal = 1;
    bool resB = cmSystemTools::RunSingleCommand(
      buildCommand, &output, &output, &retVal, installDirectory.c_str(),
      this->GeneratorVerbose, cmDuration::zero());
    if (!resB || retVal) {
      std::string tmpFile = cmStrCat(
        this->GetOption("CPACK_TOPLEVEL_DIRECTORY"), "/PreinstallOutput.log");
      cmGeneratedFileStream ofs(tmpFile);
      ofs << "# Run command: " << buildCommand << std::endl
          << "# Directory: " << installDirectory << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem running install command: "
                      << buildCommand << std::endl
                      << "Please check " << tmpFile << " for errors"
                      << std::endl);
      return 0;
    }
  }

  return 1;
}